

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O3

int __thiscall asl::TabularDataFile::init(TabularDataFile *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  String s;
  char local_18 [16];
  
  this->_dataStarted = false;
  this->_separator = ',';
  this->_decimal = '.';
  this->_quote = '\"';
  local_18[0] = '\"';
  local_18[1] = '\"';
  local_18[2] = 0;
  String::assign(&this->_equote,local_18,2);
  this->_flushEvery = 0;
  this->_rowIndex = 0;
  this->_quoteStrings = false;
  return extraout_EAX;
}

Assistant:

void TabularDataFile::init()
{
	_dataStarted = false;
	_separator = ',';
	_decimal = '.';
	_quote = '\"';
	_equote = String::repeat(_quote, 2);
	_flushEvery = 0;
	_rowIndex = 0;
	_quoteStrings = false;
}